

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialogPrivate::initHelper(QFontDialogPrivate *this,QPlatformDialogHelper *h)

{
  Object *sender;
  QSharedPointer *in_RSI;
  QFontDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QPlatformFontDialogHelper *fontDialogHelper;
  QFontDialog *q;
  QFontDialog *in_stack_ffffffffffffff68;
  Connection *this_00;
  offset_in_QFontDialog_to_subr *slot;
  QSharedPointer *context;
  offset_in_QPlatformFontDialogHelper_to_subr in_stack_ffffffffffffffc0;
  Connection local_38;
  code *local_30;
  undefined8 local_28;
  ConnectionType in_stack_ffffffffffffffe0;
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (Object *)q_func(in_RDI);
  QPlatformFontDialogHelper::setOptions(in_RSI);
  context = in_RSI;
  QFontDialog::currentFont(in_stack_ffffffffffffff68);
  (**(code **)(*(long *)in_RSI + 0x80))(in_RSI,local_18);
  QFont::~QFont(local_18);
  local_30 = QFontDialog::currentFontChanged;
  local_28 = 0;
  slot = (offset_in_QFontDialog_to_subr *)0x0;
  this_00 = (Connection *)&stack0xffffffffffffffe0;
  QObject::
  connect<void(QPlatformFontDialogHelper::*)(QFont_const&),void(QFontDialog::*)(QFont_const&)>
            (sender,in_stack_ffffffffffffffc0,(ContextType *)context,
             (offset_in_QFontDialog_to_subr *)0x0,in_stack_ffffffffffffffe0);
  QMetaObject::Connection::~Connection(this_00);
  QObject::
  connect<void(QPlatformFontDialogHelper::*)(QFont_const&),void(QFontDialog::*)(QFont_const&)>
            (sender,0,(ContextType *)context,slot,in_stack_ffffffffffffffe0);
  QMetaObject::Connection::~Connection(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::initHelper(QPlatformDialogHelper *h)
{
    Q_Q(QFontDialog);
    auto *fontDialogHelper = static_cast<QPlatformFontDialogHelper *>(h);
    fontDialogHelper->setOptions(options);
    fontDialogHelper->setCurrentFont(q->currentFont());
    QObject::connect(fontDialogHelper, &QPlatformFontDialogHelper::currentFontChanged,
                     q, &QFontDialog::currentFontChanged);
    QObject::connect(fontDialogHelper, &QPlatformFontDialogHelper::fontSelected,
                     q, &QFontDialog::fontSelected);
}